

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

void __thiscall Rml::ElementHandle::ElementHandle(ElementHandle *this,String *tag)

{
  NumericValue *local_80;
  Property local_78;
  String *local_18;
  String *tag_local;
  ElementHandle *this_local;
  
  local_18 = tag;
  tag_local = (String *)this;
  Element::Element(&this->super_Element,tag);
  (this->super_Element).super_ScriptInterface.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__ElementHandle_00816838;
  local_80 = (this->edge_margin)._M_elems;
  do {
    NumericValue::NumericValue(local_80);
    local_80 = local_80 + 1;
  } while (local_80 != (NumericValue *)&this->drag_start);
  Vector2<float>::Vector2(&this->drag_start,0.0,0.0);
  Vector2<float>::Vector2(&this->drag_delta_min);
  Vector2<float>::Vector2(&this->drag_delta_max);
  MoveData::MoveData(&this->move_data);
  SizeData::SizeData(&this->size_data);
  Property::Property<Rml::Style::Drag,Rml::Style::Drag>(&local_78,Drag);
  Element::SetProperty(&this->super_Element,Drag,&local_78);
  Property::~Property(&local_78);
  this->move_target = (Element *)0x0;
  this->size_target = (Element *)0x0;
  this->initialised = false;
  return;
}

Assistant:

ElementHandle::ElementHandle(const String& tag) : Element(tag), drag_start(0, 0)
{
	// Make sure we can be dragged!
	SetProperty(PropertyId::Drag, Property(Style::Drag::Drag));

	move_target = nullptr;
	size_target = nullptr;
	initialised = false;
}